

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,char *filename,NameSet *rowNames,NameSet *colNames,DIdxSet *intVars,bool unscale,
           bool writeZeroObjective)

{
  bool bVar1;
  Verbosity VVar2;
  SPxOut *in_RCX;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDX;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *origLP;
  Verbosity old_verbosity;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffff98;
  long *plVar3;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *old;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Verbosity local_34;
  Verbosity local_30;
  byte local_2a;
  byte local_29;
  SPxOut *p;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  p = in_RCX;
  if ((local_29 == 0) ||
     (old = in_RDX, this_00 = in_RSI,
     bVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isScaled(*(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          **)(in_RDI + 0x3068)), !bVar1)) {
    (**(code **)(**(long **)(in_RDI + 0x3068) + 0x110))
              (*(long **)(in_RDI + 0x3068),in_RSI,in_RDX,p,in_R8,local_2a & 1);
  }
  else {
    if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 4 < (int)VVar2)) {
      local_30 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      local_34 = INFO3;
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_34);
      soplex::operator<<(in_RCX,(char *)in_stack_ffffffffffffff98);
      soplex::operator<<(in_RCX,in_stack_ffffffffffffff98);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_30);
    }
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)p,(int)((ulong)in_R8 >> 0x20));
    plVar3 = (long *)0x0;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SPxLPBase(this_00,old);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLP(this_00);
    (**(code **)(*plVar3 + 0x110))(plVar3,in_RSI,in_RDX,p,in_R8,local_2a & 1);
    (**(code **)*plVar3)();
    spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)0x4a714f);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::writeFile(const char* filename, const NameSet* rowNames,
                              const NameSet* colNames, const DIdxSet* intVars, const bool unscale,
                              const bool writeZeroObjective) const
{
   ///@todo implement return value
   if(unscale && _realLP->isScaled())
   {
      SPX_MSG_INFO3(spxout, spxout << "copy LP to write unscaled original problem" << std::endl;)
      SPxLPBase<R>* origLP;
      origLP = nullptr;
      spx_alloc(origLP);
      origLP = new(origLP) SPxLPBase<R>(*_realLP);
      origLP->unscaleLP();
      origLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);
      origLP->~SPxLPBase<R>();
      spx_free(origLP);
   }
   else
      _realLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);

   return true;
}